

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

size_t suboptimality(svm_model *model,double *subopt)

{
  float *pfVar1;
  svm_example **ppsVar2;
  long in_RSI;
  ulong *in_RDI;
  float fVar3;
  double dVar4;
  float tmp;
  size_t i;
  double max_val;
  size_t max_pos;
  ulong local_28;
  double local_20;
  size_t local_18;
  
  local_18 = 0;
  local_20 = 0.0;
  local_28 = 0;
  do {
    if (*in_RDI <= local_28) {
      return local_18;
    }
    pfVar1 = v_array<float>::operator[]((v_array<float> *)(in_RDI + 5),local_28);
    fVar3 = *pfVar1;
    ppsVar2 = v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(in_RDI + 1),local_28);
    fVar3 = fVar3 * ((*ppsVar2)->ex).l.simple.label;
    ppsVar2 = v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(in_RDI + 1),local_28);
    if (((*ppsVar2)->ex).l.simple.weight <= fVar3) {
LAB_0030a25d:
      if (0.0 < fVar3) {
        pfVar1 = v_array<float>::operator[]((v_array<float> *)(in_RDI + 9),local_28);
        if (0.0 < *pfVar1) goto LAB_0030a28a;
      }
      *(undefined8 *)(in_RSI + local_28 * 8) = 0;
    }
    else {
      pfVar1 = v_array<float>::operator[]((v_array<float> *)(in_RDI + 9),local_28);
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) goto LAB_0030a25d;
LAB_0030a28a:
      pfVar1 = v_array<float>::operator[]((v_array<float> *)(in_RDI + 9),local_28);
      dVar4 = std::fabs((double)(ulong)(uint)*pfVar1);
      *(double *)(in_RSI + local_28 * 8) = (double)SUB84(dVar4,0);
    }
    if (local_20 < *(double *)(in_RSI + local_28 * 8)) {
      local_20 = *(double *)(in_RSI + local_28 * 8);
      local_18 = local_28;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

size_t suboptimality(svm_model* model, double* subopt)
{
  size_t max_pos = 0;
  // cerr<<"Subopt ";
  double max_val = 0;
  for (size_t i = 0; i < model->num_support; i++)
  {
    float tmp = model->alpha[i] * model->support_vec[i]->ex.l.simple.label;

    if ((tmp < model->support_vec[i]->ex.l.simple.weight && model->delta[i] < 0) || (tmp > 0 && model->delta[i] > 0))
      subopt[i] = fabs(model->delta[i]);
    else
      subopt[i] = 0;

    if (subopt[i] > max_val)
    {
      max_val = subopt[i];
      max_pos = i;
    }
    // cerr<<subopt[i]<<" ";
  }
  // cerr<<endl;
  return max_pos;
}